

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswSim.c
# Opt level: O0

void Ssw_SmlReinitialize(Ssw_Sml_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pIn;
  int local_2c;
  int i;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  Aig_Obj_t *pObj;
  Ssw_Sml_t *p_local;
  
  iVar1 = Aig_ManRegNum(p->pAig);
  if (iVar1 < 1) {
    __assert_fail("Aig_ManRegNum(p->pAig) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x3bf,"void Ssw_SmlReinitialize(Ssw_Sml_t *)");
  }
  iVar1 = Aig_ManRegNum(p->pAig);
  iVar2 = Aig_ManCiNum(p->pAig);
  if (iVar2 <= iVar1) {
    __assert_fail("Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/ssw/sswSim.c"
                  ,0x3c0,"void Ssw_SmlReinitialize(Ssw_Sml_t *)");
  }
  for (local_2c = 0; iVar1 = Saig_ManPiNum(p->pAig), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(p->pAig->vCis,local_2c);
    Ssw_SmlAssignRandom(p,pAVar3);
  }
  for (local_2c = 0; iVar1 = Saig_ManRegNum(p->pAig), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar3 = Saig_ManLi(p->pAig,local_2c);
    pIn = Saig_ManLo(p->pAig,local_2c);
    Ssw_SmlNodeTransferFirst(p,pAVar3,pIn);
  }
  return;
}

Assistant:

void Ssw_SmlReinitialize( Ssw_Sml_t * p )
{
    Aig_Obj_t * pObj, * pObjLi, * pObjLo;
    int i;
    assert( Aig_ManRegNum(p->pAig) > 0 );
    assert( Aig_ManRegNum(p->pAig) < Aig_ManCiNum(p->pAig) );
    // assign random info for primary inputs
    Saig_ManForEachPi( p->pAig, pObj, i )
        Ssw_SmlAssignRandom( p, pObj );
    // copy simulation info into the inputs
    Saig_ManForEachLiLo( p->pAig, pObjLi, pObjLo, i )
        Ssw_SmlNodeTransferFirst( p, pObjLi, pObjLo );
}